

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

CommandOptions * read_JP2K_S_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  uint uVar1;
  MajorMode_t MVar2;
  AESDecContext *this;
  IFileReaderFactory *in_RDX;
  uint uVar3;
  uint uVar4;
  allocator<char> local_6a1;
  HMACContext *local_6a0;
  AESDecContext *local_698;
  IFileReaderFactory *local_690;
  MXFSReader Reader;
  ui32_t write_count;
  FrameBuffer FrameBuffer;
  allocator<char> local_648 [104];
  string local_5e0 [32];
  FileWriter OutFile;
  char right_format [64];
  char left_format [64];
  undefined1 local_508 [104];
  undefined1 local_4a0 [104];
  char filename [1024];
  
  ASDCP::JP2K::MXFSReader::MXFSReader(&Reader,in_RDX);
  ASDCP::JP2K::FrameBuffer::FrameBuffer
            (&FrameBuffer,*(ui32_t *)&fileReaderFactory[6]._vptr_IFileReaderFactory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)filename,(char *)fileReaderFactory[0xf]._vptr_IFileReaderFactory,local_648);
  ASDCP::JP2K::MXFSReader::OpenRead((string *)Options);
  std::__cxx11::string::~string((string *)filename);
  if ((int)Options->mode < 0) {
    filename._8_4_ = 0;
  }
  else {
    filename[0] = '\0';
    filename[1] = '\0';
    filename[2] = '\0';
    filename[3] = '\0';
    filename[4] = '\0';
    filename[5] = '\0';
    filename[6] = '\0';
    filename[7] = '\0';
    filename[0xc] = '\0';
    filename[0xd] = '\0';
    filename[0xe] = '\0';
    filename[0xf] = '\0';
    filename[0x10] = '\0';
    filename[0x11] = '\0';
    filename[0x12] = '\0';
    filename[0x13] = '\0';
    filename[0x1c] = '\0';
    filename[0x1d] = '\0';
    filename[0x1e] = '\0';
    filename[0x1f] = '\0';
    filename[0x20] = '\0';
    filename[0x21] = '\0';
    filename[0x22] = '\0';
    filename[0x23] = '\0';
    ASDCP::JP2K::MXFSReader::FillPictureDescriptor((PictureDescriptor *)local_4a0);
    Kumu::Result_t::~Result_t((Result_t *)local_4a0);
    if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 5) == '\x01') {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)&fileReaderFactory[6]._vptr_IFileReaderFactory);
      ASDCP::JP2K::PictureDescriptorDump((PictureDescriptor *)filename,(_IO_FILE *)0x0);
    }
    if ((-1 < (int)Options->mode) &&
       (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
      this = (AESDecContext *)operator_new(8);
      ASDCP::AESDecContext::AESDecContext(this);
      ASDCP::AESDecContext::InitKey((uchar *)filename);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)filename);
      Kumu::Result_t::~Result_t((Result_t *)filename);
      local_698 = this;
      if (((int)Options->mode < 0) ||
         (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 2) != '\x01')) {
        local_6a0 = (HMACContext *)0x0;
      }
      else {
        ASDCP::WriterInfo::WriterInfo((WriterInfo *)filename);
        ASDCP::JP2K::MXFSReader::FillWriterInfo((WriterInfo *)local_508);
        Kumu::Result_t::~Result_t((Result_t *)local_508);
        if (filename[0x41] == '\x01') {
          local_6a0 = (HMACContext *)operator_new(8);
          ASDCP::HMACContext::HMACContext(local_6a0);
          ASDCP::HMACContext::InitKey((uchar *)local_648,(LabelSet_t)local_6a0);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
          Kumu::Result_t::~Result_t((Result_t *)local_648);
        }
        else {
          fputs("File does not contain HMAC values, ignoring -m option.\n",_stderr);
          local_6a0 = (HMACContext *)0x0;
        }
        ASDCP::WriterInfo::~WriterInfo((WriterInfo *)filename);
      }
      goto LAB_0010c95b;
    }
  }
  local_6a0 = (HMACContext *)0x0;
  local_698 = (AESDecContext *)0x0;
LAB_0010c95b:
  uVar1 = *(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4);
  if (uVar1 == 0) {
    uVar1 = filename._8_4_;
  }
  uVar1 = uVar1 + *(int *)&fileReaderFactory[4]._vptr_IFileReaderFactory;
  if ((uint)filename._8_4_ <= uVar1) {
    uVar1 = filename._8_4_;
  }
  snprintf(left_format,0x40,"%%s%%0%duL.j2c",
           (ulong)*(uint *)((long)&fileReaderFactory[3]._vptr_IFileReaderFactory + 4));
  snprintf(right_format,0x40,"%%s%%0%duR.j2c");
  MVar2 = Options->mode;
  local_690 = fileReaderFactory;
  for (uVar3 = *(uint *)&fileReaderFactory[4]._vptr_IFileReaderFactory;
      (-1 < (int)MVar2 && (uVar3 < uVar1)); uVar3 = uVar3 + 1) {
    uVar4 = (uint)(Result_t *)local_648;
    ASDCP::JP2K::MXFSReader::ReadFrame
              (uVar4,(StereoscopicPhase_t)&Reader,(FrameBuffer *)(ulong)uVar3,(AESDecContext *)0x0,
               (HMACContext *)&FrameBuffer);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
    Kumu::Result_t::~Result_t((Result_t *)local_648);
    MVar2 = Options->mode;
    if (-1 < (int)MVar2) {
      Kumu::FileWriter::FileWriter(&OutFile);
      snprintf(filename,0x400,left_format,local_690[7]._vptr_IFileReaderFactory,(ulong)uVar3);
      std::__cxx11::string::string<std::allocator<char>>(local_5e0,filename,&local_6a1);
      Kumu::FileWriter::OpenWrite((string *)local_648);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
      Kumu::Result_t::~Result_t((Result_t *)local_648);
      std::__cxx11::string::~string(local_5e0);
      if (-1 < (int)Options->mode) {
        Kumu::FileWriter::Write((uchar *)local_648,(uint)&OutFile,(uint *)FrameBuffer._8_8_);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
        Kumu::Result_t::~Result_t((Result_t *)local_648);
      }
      if (*(char *)((long)&local_690[1]._vptr_IFileReaderFactory + 5) == '\x01') {
        ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
      }
      Kumu::FileWriter::~FileWriter(&OutFile);
      MVar2 = Options->mode;
      if (-1 < (int)MVar2) {
        ASDCP::JP2K::MXFSReader::ReadFrame
                  (uVar4,(StereoscopicPhase_t)&Reader,(FrameBuffer *)(ulong)uVar3,
                   (AESDecContext *)0x1,(HMACContext *)&FrameBuffer);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
        Kumu::Result_t::~Result_t((Result_t *)local_648);
        MVar2 = Options->mode;
        if (-1 < (int)MVar2) {
          Kumu::FileWriter::FileWriter(&OutFile);
          snprintf(filename,0x400,right_format,local_690[7]._vptr_IFileReaderFactory,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>(local_5e0,filename,&local_6a1);
          Kumu::FileWriter::OpenWrite((string *)local_648);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
          Kumu::Result_t::~Result_t((Result_t *)local_648);
          std::__cxx11::string::~string(local_5e0);
          if (-1 < (int)Options->mode) {
            Kumu::FileWriter::Write((uchar *)local_648,(uint)&OutFile,(uint *)FrameBuffer._8_8_);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_648);
            Kumu::Result_t::~Result_t((Result_t *)local_648);
          }
          Kumu::FileWriter::~FileWriter(&OutFile);
          MVar2 = Options->mode;
        }
      }
    }
  }
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  ASDCP::JP2K::MXFSReader::~MXFSReader(&Reader);
  return Options;
}

Assistant:

Result_t
read_JP2K_S_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  JP2K::MXFSReader    Reader(fileReaderFactory);
  JP2K::FrameBuffer  FrameBuffer(Options.fb_size);
  ui32_t             frame_count = 0;

  Result_t result = Reader.OpenRead(Options.filenames[0]);

  if ( ASDCP_SUCCESS(result) )
    {
      JP2K::PictureDescriptor PDesc;
      Reader.FillPictureDescriptor(PDesc);

      frame_count = PDesc.ContainerDuration;

      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  JP2K::PictureDescriptorDump(PDesc);
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  const int filename_max = 1024;
  char filename[filename_max];
  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char left_format[64];  char right_format[64];
  snprintf(left_format,  64, "%%s%%0%duL.j2c", Options.number_width);
  snprintf(right_format, 64, "%%s%%0%duR.j2c", Options.number_width);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, JP2K::SP_LEFT, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  snprintf(filename, filename_max, left_format, Options.file_root, i);
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);

	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);
	}

      if ( ASDCP_SUCCESS(result) )
	result = Reader.ReadFrame(i, JP2K::SP_RIGHT, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  snprintf(filename, filename_max, right_format, Options.file_root, i);
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	}
    }

  return result;
}